

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O3

char * prev_path_ele(char *start,char *p,size_t *ele_len)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  
  pcVar2 = (char *)0x0;
  pcVar3 = pcVar2;
  if (p != start) {
    iVar4 = 0;
    pcVar3 = p;
    do {
      uVar5 = ~(ulong)pcVar3;
      do {
        pcVar6 = pcVar3;
        if (pcVar6 == start) {
          sVar7 = 0;
          pcVar3 = start;
          goto LAB_0020aa52;
        }
        uVar5 = uVar5 + 1;
        pcVar3 = pcVar6 + -1;
      } while (pcVar6[-1] == '/');
      do {
        pcVar3 = start;
        if (pcVar6 == start) break;
        pcVar1 = pcVar6 + -1;
        pcVar3 = pcVar6;
        pcVar6 = pcVar6 + -1;
      } while (*pcVar1 != '/');
      pcVar6 = pcVar3 + uVar5;
      sVar7 = -(long)pcVar6;
      if (pcVar6 == (char *)0xfffffffffffffffe) {
        if ((*pcVar3 != '.') || (pcVar3[1] != '.')) goto LAB_0020aa2c;
        iVar4 = iVar4 + 1;
        if (pcVar2 == (char *)0x0) {
          pcVar2 = pcVar3;
        }
      }
      else if ((pcVar6 != (char *)0xffffffffffffffff) || (*pcVar3 != '.')) {
LAB_0020aa2c:
        if (iVar4 == 0) goto LAB_0020aa52;
        iVar4 = iVar4 + -1;
        if (iVar4 == 0) {
          pcVar2 = (char *)0x0;
        }
      }
    } while (pcVar3 != start);
    sVar7 = (size_t)((uint)(pcVar2 != (char *)0x0) * 2);
    pcVar3 = pcVar2;
LAB_0020aa52:
    *ele_len = sVar7;
  }
  return pcVar3;
}

Assistant:

static const char *prev_path_ele(const char *start, const char *p,
                                 size_t *ele_len)
{
    int cancel = 0;
    const char *dotdot = 0;

    /* if we're at the start of the string, there are no more elements */
    if (p == start)
        return 0;

    /* keep going until we find a suitable element */
    for (;;)
    {
        const char *endp;

        /*
         *   If we've reached the start of the string, it means that we have
         *   ".."'s that canceled out every earlier element of the string.
         *   If the cancel count is non-zero, it means that we have one or
         *   more ".."'s that are significant (in that they cancel out
         *   relative elements before the start of the string).  If the
         *   cancel count is zero, it means that we've exactly canceled out
         *   all remaining elements in the string.
         */
        if (p == start)
        {
            *ele_len = (dotdot != 0 ? 2 : 0);
            return dotdot;
        }
        
        /* 
         *   back up through any adjacent path separators before the current
         *   element, so that we're pointing to the first separator after the
         *   previous element
         */
        for ( ; p != start && ispathchar(*(p-1)) ; --p) ;

        /*
         *   If we're at the start of the string, this is an absolute path.
         *   Treat it specially by returning a zero-length initial element. 
         */
        if (p == start)
        {
            *ele_len = 0;
            return p;
        }

        /* note where the current element ends */
        endp = p;

        /* now back up to the path separator before this element */
        for ( ; p != start && !ispathchar(*(p-1)) ; --p) ;

        /* 
         *   if this is ".", skip it, since this simply means that this
         *   element matches the same folder as the previous element 
         */
        if (endp - p == 1 && p[0] == '.')
            continue;

        /* 
         *   if this is "..", it cancels out the preceding non-relative
         *   element; up the cancel count and keep searching 
         */
        if (endp - p == 2 && p[0] == '.' && p[1] == '.')
        {
            /* up the cancel count */
            ++cancel;

            /* if this is the first ".." we've encountered, note it */
            if (dotdot == 0)
                dotdot = p;

            /* keep searching */
            continue;
        }

        /*
         *   This is an ordinary path element, not a relative "." or ".."
         *   link.  If we have a non-zero cancel count, we're still working
         *   on canceling out elements from ".."'s we found later in the
         *   string.
         */
        if (cancel != 0)
        {
            /* this absorbs one level of cancellation */
            --cancel;

            /* 
             *   if that's the last cancellation, we've absorbed all ".."
             *   effects, so the last ".." we found is no longer significant 
             */
            if (cancel == 0)
                dotdot = 0;

            /* keep searching */
            continue;
        }

        /* this item isn't canceled out by a "..", so it's our winner */
        *ele_len = endp - p;
        return p;
    }
}